

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::StringMaker<double,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<double,void> *this,double value)

{
  long lVar1;
  long lVar2;
  ReusableStringStream rss;
  string local_38 [32];
  
  if (NAN(value)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"nan",(allocator<char> *)local_38);
  }
  else {
    lVar2 = (long)precision;
    ReusableStringStream::ReusableStringStream(&rss);
    lVar1 = *(long *)rss.m_oss;
    *(long *)(rss.m_oss + *(long *)(lVar1 + -0x18) + 8) = lVar2;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(rss.m_oss + lVar1 + 0x18) = *(uint *)(rss.m_oss + lVar1 + 0x18) & 0xfffffefb | 4;
    std::ostream::_M_insert<double>(value);
    std::__cxx11::stringbuf::str();
    lVar1 = std::__cxx11::string::find_last_not_of((char)__return_storage_ptr__,0x30);
    if ((lVar1 != -1) && (lVar1 != __return_storage_ptr__->_M_string_length - 1)) {
      std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_38);
      std::__cxx11::string::~string(local_38);
    }
    ReusableStringStream::~ReusableStringStream(&rss);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<double>::convert(double value) {
    return Detail::fpToString(value, precision);
}